

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3-read.c
# Opt level: O2

int mp3_read_si(mp3_frame_t *frame)

{
  mp3_channel_t *pmVar1;
  uchar uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  unsigned_long uVar7;
  uint uVar8;
  uint i;
  ulong uVar9;
  uint *puVar10;
  uint *puVar11;
  uint j;
  mp3_channel_t *pmVar12;
  uint band;
  long lVar13;
  bool bVar14;
  uint local_64;
  bv_t bv;
  
  if (frame == (mp3_frame_t *)0x0) {
    __assert_fail("frame != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-read.c",0x17,
                  "int mp3_read_si(mp3_frame_t *)");
  }
  bv_init(&bv,frame->raw + (ulong)(frame->protected == '\0') * 2 + 4,(uint)frame->si_bitsize);
  (frame->si).channel[0].granule[0].part2_3_length = 0;
  (frame->si).channel[0].granule[1].part2_3_length = 0;
  pmVar1 = (frame->si).channel;
  (frame->si).channel[1].granule[0].part2_3_length = 0;
  (frame->si).channel[1].granule[1].part2_3_length = 0;
  uVar2 = frame->id;
  bVar14 = frame->mode == '\x03';
  frame->adu_bitsize = 0;
  uVar8 = 2 - bVar14;
  uVar5 = bVar14 + 3 + (uint)bVar14;
  if (uVar2 != '\x03') {
    uVar5 = uVar8;
  }
  uVar7 = bv_get_bits(&bv,uVar2 == '\x03' | 8);
  (frame->si).main_data_end = (uint)uVar7;
  uVar7 = bv_get_bits(&bv,uVar5);
  (frame->si).private_bits = (uint)uVar7;
  if (uVar2 == '\x03') {
    local_64 = 4;
    pmVar12 = pmVar1;
    for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
        uVar7 = bv_get_bits(&bv,1);
        pmVar12->scfsi[lVar13] = (uchar)uVar7;
      }
      pmVar12 = pmVar12 + 1;
    }
  }
  else {
    local_64 = 9;
  }
  puVar10 = (frame->si).channel[0].granule[0].sub_gain;
  puVar11 = (frame->si).channel[0].granule[0].tbl_sel;
  uVar9 = 0;
  do {
    if (uVar9 == uVar8) {
      frame->adu_size = frame->adu_bitsize + 7 >> 3;
      return 1;
    }
    uVar7 = bv_get_bits(&bv,0xc);
    pmVar1[uVar9].granule[0].part2_3_length = (int)uVar7;
    frame->adu_bitsize = frame->adu_bitsize + (long)(int)uVar7;
    uVar7 = bv_get_bits(&bv,9);
    pmVar1[uVar9].granule[0].big_values = (uint)uVar7;
    uVar7 = bv_get_bits(&bv,8);
    pmVar1[uVar9].granule[0].global_gain = (uint)uVar7;
    uVar7 = bv_get_bits(&bv,local_64);
    pmVar1[uVar9].granule[0].scale_comp = (uint)uVar7;
    uVar7 = bv_get_bits(&bv,1);
    pmVar1[uVar9].granule[0].blocksplit_flag = (uint)uVar7;
    if ((uint)uVar7 == 0) {
      for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
        uVar7 = bv_get_bits(&bv,5);
        puVar11[lVar13] = (uint)uVar7;
      }
      uVar7 = bv_get_bits(&bv,4);
      pmVar1[uVar9].granule[0].reg0_cnt = (uint)uVar7;
      uVar7 = bv_get_bits(&bv,3);
      pmVar1[uVar9].granule[0].reg1_cnt = (uint)uVar7;
      pmVar1[uVar9].granule[0].block_type = 0;
      pmVar1[uVar9].granule[0].switch_point = 0;
    }
    else {
      uVar7 = bv_get_bits(&bv,2);
      pmVar1[uVar9].granule[0].block_type = (uint)uVar7;
      if ((uint)uVar7 == 0) {
        fwrite("Frame has reserved windowing type, skipping...\n",0x2f,1,_stderr);
        return 0;
      }
      uVar7 = bv_get_bits(&bv,1);
      pmVar1[uVar9].granule[0].switch_point = (uint)uVar7;
      uVar7 = bv_get_bits(&bv,5);
      pmVar1[uVar9].granule[0].tbl_sel[0] = (uint)uVar7;
      uVar7 = bv_get_bits(&bv,5);
      pmVar1[uVar9].granule[0].tbl_sel[1] = (uint)uVar7;
      pmVar1[uVar9].granule[0].tbl_sel[2] = 0;
      for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
        uVar7 = bv_get_bits(&bv,3);
        puVar10[lVar13] = (uint)uVar7;
      }
      pmVar1[uVar9].granule[0].reg0_cnt = pmVar1[uVar9].granule[0].block_type == 2 | 8;
      pmVar1[uVar9].granule[0].reg1_cnt = 0;
    }
    uVar5 = 0;
    if (uVar2 == '\x03') {
      uVar7 = bv_get_bits(&bv,1);
      uVar5 = (uint)uVar7;
    }
    pmVar1[uVar9].granule[0].preflag = uVar5;
    uVar7 = bv_get_bits(&bv,1);
    pmVar1[uVar9].granule[0].scale_scale = (uint)uVar7;
    uVar7 = bv_get_bits(&bv,1);
    pmVar1[uVar9].granule[0].cnt1tbl_sel = (uint)uVar7;
    uVar5 = pmVar1[uVar9].granule[0].scale_comp;
    uVar3 = pmVar1[uVar9].granule[0].block_type;
    uVar4 = mp3_read_si::slen_table[0][uVar5];
    uVar5 = mp3_read_si::slen_table[1][uVar5];
    pmVar1[uVar9].granule[0].slen0 = uVar4;
    pmVar1[uVar9].granule[0].slen1 = uVar5;
    if (uVar3 == 2) {
      if (pmVar1[uVar9].granule[0].switch_point == 0) {
        iVar6 = (uVar5 + uVar4) * 0x12;
      }
      else {
        iVar6 = uVar5 * 0x12 + uVar4 * 0x11;
      }
    }
    else {
      iVar6 = uVar5 * 10 + uVar4 * 0xb;
    }
    pmVar1[uVar9].granule[0].part2_length = iVar6;
    pmVar1[uVar9].granule[0].part3_length = pmVar1[uVar9].granule[0].part2_3_length - iVar6;
    uVar9 = uVar9 + 1;
    puVar10 = puVar10 + 0x9ca;
    puVar11 = puVar11 + 0x9ca;
  } while( true );
}

Assistant:

int mp3_read_si(mp3_frame_t *frame) {
  assert(frame != NULL);
  assert((frame->si_bitsize != 0) ||
         "Trying to read an empty sideinfo");

  unsigned char *ptr = frame->raw + 4; /* skip header */
  if (/*@-type@*/ frame->protected == 0)
    ptr += 2;

  bv_t bv;
  bv_init(&bv, ptr, frame->si_bitsize);

  const int is_lsf = frame->id != MPEG_VERSION_1; // MPEG 2 and 2.5 are Lower Sampling Frequency extension

  /* reset granule content length */
  frame->si.channel[0].granule[0].part2_3_length = 0;
  frame->si.channel[0].granule[1].part2_3_length = 0;
  frame->si.channel[1].granule[0].part2_3_length = 0;
  frame->si.channel[1].granule[1].part2_3_length = 0;

  mp3_si_t *si = &frame->si;
  /* stereo or mono */
  unsigned int nch = (frame->mode != 3) ? 2 : 1;

  frame->adu_bitsize = 0;

  /*M
    \emph{End of main data.}

   (ISO) The value of main data end is used to determine the
   location in the bitstream of the last bit of main data for the
   frame. The main data end value specifies the location as a negative
   offset in bytes from the next frame's frame header location in the
   main data portion of the bitstream
  **/
  si->main_data_end = bv_get_bits(&bv, is_lsf ? 8 : 9);

  /*M
    \emph{Private bits,}

   (ISO) Bits for private use. These bits will not be used in the
   future by ISO
  **/
  const int private_bitlen = is_lsf ? ((nch == 1) ? 1 : 2) :
                             ((nch == 1) ? 5 : 3);
  si->private_bits = bv_get_bits(&bv, private_bitlen);

  /*M
    \emph{Scalefactor selection information.}

   (ISO) In Layer III the scalefactor selection information works
   similarly to Layers I and II. The main difference is the use of the
   variable scfsi band to apply scfsi to groups of scalefactors
   instead of single scalefactors. scfsi controls the use of
   scalefactors to the granules.
   \begin{itemize}
   \item '0' - scalefactors are transmitted for each granule
   \item '1' - scalefactors transmitted for granule 0 are also valid for
         granule 1
   \end{itemize}
   If short windows are switched on, i.e. block type == 2 for one
   of the granules, then scfsi is always 0 for this frame.
  **/

  int ngr = 1;

  if (!is_lsf) {
    unsigned int i;
    for (i = 0; i < nch; i++) {
      unsigned int band;
      for (band = 0; band < 4; band++)
        si->channel[i].scfsi[band] = bv_get_bits(&bv, 1);
    }
  }

  unsigned int gri;
  int i = 0;
  for (gri = 0; gri < ngr; gri++) {
    for (i = 0; i < nch; i++) {
      mp3_granule_t *gr = &si->channel[i].granule[gri];

      /*M
        \emph{Length of main data.}

       (ISO) This value contains the number of main data bits used
       for scalefactors and Huffman code data. Because the length
       of the side inforamtion is always the same, this value can
       be used to calculate the beginning of the main inforamtion
       for each granule and the position of ancillary information
       (is used).
      **/
      gr->part2_3_length = bv_get_bits(&bv, 12);
      /* sum the granule main data lengths into the adu size */
      frame->adu_bitsize += gr->part2_3_length;

      /*M
        \emph{Length of ``big'' Huffman data.}

       (ISO) The spectral values of each granule are coded with
       different Huffman code tables. The full frequency ranges
       from zero to the Nyquist frequency is divided into several
       regions, which then are coded using different
       tables. Partitioning is done according to the maximum
       quantized values. This is done with the assumption that
       values at higher frequencies are expected to have lower
       amplitudes or don't need to be coded at all. Starting at
       high frequencies, the pairs of quantized values equal to
       zero are counted. This number is named "rzero". Then,
       quadruples of quantized values with absolute value not
       exceeding 1 (i.e. only 3 possible quantization levels) are
       counted. This number is named "count1". Again an even number
       of values remains. Finally, the number of pairs of values in
       the region of the spectrum which extends down to zero is
       named "big values". The maximum absolute value in this range
       is constrained to 8191.
       The figure shows the partitioning:
       \begin{verbatim}
xxxxxxxxxxxxx------------------0000000000000000000000000000
|           |                 |                           |
1          bigvalues*2        bigvalues*2+count1*4
\end{verbatim}

       The values 000 are all zero.
       The values --- are -1, 0 or +1. Their number is a multiple
       of 4.
       The values xxx are not bound.
       Iblen is 576.
      **/
      gr->big_values = bv_get_bits(&bv, 9);
      assert((gr->big_values <= 288) || "big_values are too large");

      /*M
        \emph{Global gain.}

       (ISO) The quantizer step size information is transmitted in
       the side information variable global gain. It is
       logarithmically quantized. For the application of
       global gain, refer to the formula in 2.4.3.4 "Formula for
       requantization and all scaling".
      **/
      gr->global_gain = bv_get_bits(&bv, 8);

      /*M
        \emph{Scalefactor compression.}

       (ISO) Selects the number of bits used for the transmission
       of the scalefactors according to the following table:
       if block type is 0, 1, or 3:
       \begin{itemize}
       \item slen1 : length of scalefactors for the scalefactor bands 0
       to 10
       \item slen2 : length of scalefactors for the scalefactor bands 11
       to 20
       \end{itemize}

       if block type is 2 and switch point is 0:
       \begin{itemize}
       \item slen1 : length of scalefactors for the scalefactor bands 0
       to 5
       \item slen2 : length of scalefactors for the scalefactor bands 6
       to 11
       \end{itemize}

       if block type is 2 and switch point is 1:
       \begin{itemize}
       \item slen1 : length of scalefactors for the scalefactor bands 0
       to 7 (long window scalefactor band) and 4 to 5 (short
       scalefactor band). Note: scalefactor bands 0-7 are from the
       "long window scalefactor band" table, and scalefactor bands
       4-11 from the "short window scalefactor bands" table. This
       combination of partitions is contiguous and spans the entire
       frequency spectrum.
       \item slen2 : length of scalefactors for the scalefactor bands 6
       to 11
       \end{itemize}

       \begin{tabular}{|l|l|l|}
       \hline
       scale comp &  slen1 & slen2 \\
       \hline
       0     &       0  &   0 \\
       1     &       0  &   1 \\
       2     &       0  &   2 \\
       3     &       0  &   3 \\
       4     &       3  &   0 \\
       5     &       1  &   1 \\
       6     &       1  &   2 \\
       7     &       1  &   3 \\
       8     &       2  &   1 \\
       9     &       2  &   2 \\
       10    &       2  &   3 \\
       11    &       3  &   1 \\
       12    &       3  &   2 \\
       13    &       3  &   3 \\
       14    &       4  &   2 \\
       15    &       4  &   3 \\
       \hline
       \end{tabular}
       **/
      gr->scale_comp = bv_get_bits(&bv, is_lsf ? 9 : 4);

      /*M
        \emph{Block windowing split flag.}

       (ISO) Signals that the block uses an other than normal (type
       0) window. If blocksplit flag is set, several other
       variables are set by default:
       \begin{itemize}
       \item region address1 = 8 (in case of block type == 1 or
       block type == 3)
       \item region address1 = 9 (in case of block type == 2)
       \item region address2 = 0 In this case the length of region 2 is
       zero
       \end{itemize}

       If blocksplit flag is not set, then the value of block type
       is zero.
      **/
      gr->blocksplit_flag = bv_get_bits(&bv, 1);

      if (gr->blocksplit_flag != 0) {
        /*M
          \emph{Windowing type.}

          (ISO) Indicates the window type for the actual granule
          (see description of the filterbank, Layer III).
          \begin{itemize}
          \item type 0 - reserved
          \item type 1 - start block
          \item type 2 - 3 short windows
          \item type 3 - end block
          \end{itemize}

         Block type and switch point give the information about
         assembling of values in the block and about length and
         count of the transforms. In the case of block type == 2,
         the switch point indicates whether some polyphase filter
         subbands are coded using long transforms even in case of
         block type 2. The polyphase filterbank is described in the
         clause 2.4.3.2 of Layer I.

         In the case of long block (block type not equal to 2 or in
         the lower subbands of block type 2) the IMDCT generates an
         output of 36 values every 18 input values. The output is
         windowed depending on the block type and the first half is
         overlapped with the second half of the block before. The
         resulting vector is the input of the synthesis part of the
         polyphase filterbank of one band.

         In the case of short blocks (in the upper subbands of a
         type 2 block) three transforms are performed producing 12
         output values each. The three vectors are windowed and
         overlapped each. Concatenating 6 zeros on both ends of the
         resulting vector gives a vector of length 36, which is
         processed like the output of a long transform.
        **/
        gr->block_type = bv_get_bits(&bv, 2);

        /* if block type is reserved we have a wrong frame */
        if (gr->block_type == 0) {
          fprintf(stderr, "Frame has reserved windowing type, skipping...\n");
          return 0;
        }

        /*M
          \emph{Switch point.}

         (ISO) Signals the split point of short/long
         transforms. The following table shows the number of the
         scalefactor band above which window switching
         (i.e. block type different from 0 is used.

         \begin{tabular}{|l|l|l|}
         \hline
         switch point &  switch point 1 &  switch point s \\
                      & (No of sb)     &  (No of sb) \\
         \hline
          0         &    0      &         0 \\
         \hline
         \multicolumn{3}{|c|}{; switching of the whole spectrum} \\
         \hline
         1        &     8        &       3 \\
         \hline
         \multicolumn{3}{|c|}{; switching of higher frequencies only} \\
         \hline
         \end{tabular}

         \begin{description}
         \item[switching point 1]: Number of scalefactor band (long block
         scalefactor band) from which point on window switching is
         used
         \item[switching point s]: Number of scalefactor band (short
         block scalefactor band) from which point on window
         switching is used.
         \end{description}
        **/
        gr->switch_point = bv_get_bits(&bv, 1);

        /*M
          \emph{Huffman code table selection.}

         (ISO) Different Huffman code tables are used depending on the
         maximum quantized value and the local statistics of the
         signal. There are a total of 32 possible tables given in
         3-Annex B Table 3-B.7.
        **/
        gr->tbl_sel[0] = bv_get_bits(&bv, 5);
        gr->tbl_sel[1] = bv_get_bits(&bv, 5);
        gr->tbl_sel[2] = 0;

        /*M
          \emph{Subblock gain offset.}

         (ISO) Indicates the gain offset (quantization: factor 4) from
         the global gain for one subblock. Used only with block type 2
         (short windows). The values of the subblock have to be
         divided by $4.^{\textrm{subblock gain(window)}}$ in the
         decoder.
        **/
        unsigned int j;
        for (j = 0; j < 3; j++)
          gr->sub_gain[j] = bv_get_bits(&bv, 3);

        /* implicitly set */
        if (gr->block_type == 2)
          gr->reg0_cnt = 9;
        else
          gr->reg0_cnt = 8;
        gr->reg1_cnt = 0;

      } else {
        unsigned int j;
        for (j = 0; j < 3; j++)
          gr->tbl_sel[j] = bv_get_bits(&bv, 5);

        /*M
          \emph{First region subdivision information.}

         (ISO) A further partitioning of the spectrum is used to
         enhance the performance of the Huffman coder. It is a
         subdivision of the region which is described by
         big values. The purpose of this subdivision is to get
         better error robustness and better coding
         efficiency. Three regions are used. Each region is coded
         using a different Huffman code table depending on the
         maximum quantized value and the loval signal
         statistics. The values region address[1,2] are used to
         point to the boundaries of the regions. The region
         boundaries are aligned with the partitioning of the
         spectrum into critical bands.

         In case of block type == 2 (short blocks) the scalefactor
         bands representing the different time slots are counted
         separately. If switch point == 0, the total amount of
         scalefactor bands for the granule in this case is $12 * 3
         = 36$. If block type == 2 and switch point == 1, the amount
         of scalefactor bands is $8 + 9 * 3 = 35$. region address1
         counts the number of scalefactor bands until the upper
         edge of the first region:

         \begin{tabular}{|l|l|}
         \hline
         region address1   &     upper edge of region is upper edge
                                 of scalefactor band number \\
         \hline
         0     &                  0 (no first region)  \\
         1     &                  1 \\
         2     &                  2 \\
         ...   &                  ... \\
         15    &                  15 \\
         \hline
         \end{tabular}
        **/
        gr->reg0_cnt = bv_get_bits(&bv, 4);

        /*M
          \emph{Second region subdivision information.}

         (ISO) Region address2 counts the number of scalefactor
         bands which are partially or totally in region 3. Again if
         block type == 2 the scalefactor bands representing
         different time slots are counted separately.
        **/
        gr->reg1_cnt = bv_get_bits(&bv, 3);

        /* implicitly set */
        gr->block_type = 0;
        gr->switch_point = 0;
      }

      if (!is_lsf) {

        /*M
          \emph{Additional high frequency amplification flag.}

         (ISO) This is a shortcut for additional high frequency
         amplification of the quantized values. If preflag is set,
         the values of a table are added to the scalefactors (see
         3-Annex B, Table 3-B.6). This is equivalent to
         multiplication of the requantized scalefactors with tables
         values. preflag is never used if block type == 2 (short blocks).
        **/
        gr->preflag = bv_get_bits(&bv, 1);
      } else {
        gr->preflag = 0;
      }

      /*M
        \emph{Scalefactor scale step size.}

       (ISO) The scalefactors are logarithmically quantized with a
       step size of 2 (or sqrt(2)) depending on scalefac scale

       scalefac scale = 0      stepsize sqrt(2)
       scalefac scale = 1      stepsize 2
      **/
      gr->scale_scale = bv_get_bits(&bv, 1);

      /*M
        (ISO) This flag selects one of two possible Huffman code
        tables for the region of quadruples of quantized values with
        magnitude not exceeding 1.

        \begin{itemize}
        \item count1table select = 0       Table A of 3-Annex B.7
        \item count1table select = 1       Table B of 3-Annex B.7
        \end{itemize}
      **/
      gr->cnt1tbl_sel = bv_get_bits(&bv, 1);

      /*M
        \emph{Scalefactor length compression table}

        Table to get scalefactor length information from scale comp.
      */
      static const int slen_table[2][16] = {
          {0, 0, 0, 0,
              3, 1, 1, 1,
              2, 2, 2, 3,
              3, 3, 4, 4},
          {0, 1, 2, 3,
              0, 1, 2, 3,
              1, 2, 3, 1,
              2, 3, 2, 3}
      };

      /*M
        \emph{Scalefactor length}

        Calculate the bitlength of the scalefactors.
      **/
      gr->slen0 = slen_table[0][gr->scale_comp];
      gr->slen1 = slen_table[1][gr->scale_comp];

      /*M
        \emph{Scalefactor total size}

        Calculate the total size of the scalefactor information for
        the granule.
      **/
      if (gr->block_type == 2) {
        if (gr->switch_point != 0)
          gr->part2_length = 17 * gr->slen0 + 18 * gr->slen1;
        else
          gr->part2_length = 18 * gr->slen0 + 18 * gr->slen1;
      } else {
        gr->part2_length = 11 * gr->slen0 + 10 * gr->slen1;
      }

      gr->part3_length = gr->part2_3_length - gr->part2_length;
    }
  }

  frame->adu_size = (frame->adu_bitsize + 7) / 8;

  assert((bv.len == bv.idx) || "Side information not read completely");

  return 1;
}